

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

deflate_allocs * alloc_deflate(zng_stream *strm,int windowBits,int lit_bufsize)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  deflate_allocs *pdVar9;
  int iVar10;
  
  iVar8 = 2 << ((byte)windowBits & 0x1f);
  iVar10 = (-iVar8 & 0x3eU) + iVar8;
  iVar7 = iVar10 + iVar8;
  iVar7 = (-iVar7 & 0x3eU) + iVar7;
  iVar4 = (-iVar7 & 0x3eU) + iVar7 + 0x20000;
  iVar2 = lit_bufsize * 5 + iVar4;
  iVar2 = (-iVar2 & 0x3fU) + iVar2;
  iVar1 = iVar2 + (-iVar2 & 0xfU);
  pvVar3 = (*strm->zalloc)(strm->opaque,1,(-iVar1 - 0x17f7U & 0x3f) + iVar1 + 0x1877);
  if (pvVar3 == (void *)0x0) {
    pdVar9 = (deflate_allocs *)0x0;
  }
  else {
    lVar6 = (ulong)(-(int)pvVar3 & 0x3f) + (long)pvVar3;
    lVar5 = (long)(int)((-iVar2 & 0xfU) + 0x1800 + iVar2);
    pdVar9 = (deflate_allocs *)(lVar6 + lVar5);
    *(void **)(lVar5 + lVar6) = pvVar3;
    *(free_func *)(lVar5 + 8 + lVar6) = strm->zfree;
    *(long *)(lVar5 + 0x18 + lVar6) = lVar6;
    pvVar3 = (void *)(iVar10 + lVar6);
    *(void **)(lVar5 + 0x28 + lVar6) = pvVar3;
    *(long *)(lVar5 + 0x30 + lVar6) = iVar7 + lVar6;
    *(long *)(lVar5 + 0x20 + lVar6) = iVar4 + lVar6;
    *(long *)(lVar5 + 0x10 + lVar6) = iVar2 + lVar6;
    memset(pvVar3,0,(long)iVar8);
  }
  return pdVar9;
}

Assistant:

Z_INTERNAL deflate_allocs* alloc_deflate(PREFIX3(stream) *strm, int windowBits, int lit_bufsize) {
    int curr_size = 0;

    /* Define sizes */
    int window_size = DEFLATE_ADJUST_WINDOW_SIZE((1 << windowBits) * 2);
    int prev_size = (1 << windowBits) * (int)sizeof(Pos);
    int head_size = HASH_SIZE * sizeof(Pos);
    int pending_size = lit_bufsize * LIT_BUFS;
    int state_size = sizeof(deflate_state);
    int alloc_size = sizeof(deflate_allocs);

    /* Calculate relative buffer positions and paddings */
    LOGSZP("window", window_size, PAD_WINDOW(curr_size), PADSZ(curr_size,WINDOW_PAD_SIZE));
    int window_pos = PAD_WINDOW(curr_size);
    curr_size = window_pos + window_size;

    LOGSZP("prev", prev_size, PAD_64(curr_size), PADSZ(curr_size,64));
    int prev_pos = PAD_64(curr_size);
    curr_size = prev_pos + prev_size;

    LOGSZP("head", head_size, PAD_64(curr_size), PADSZ(curr_size,64));
    int head_pos = PAD_64(curr_size);
    curr_size = head_pos + head_size;

    LOGSZP("pending", pending_size, PAD_64(curr_size), PADSZ(curr_size,64));
    int pending_pos = PAD_64(curr_size);
    curr_size = pending_pos + pending_size;

    LOGSZP("state", state_size, PAD_64(curr_size), PADSZ(curr_size,64));
    int state_pos = PAD_64(curr_size);
    curr_size = state_pos + state_size;

    LOGSZP("alloc", alloc_size, PAD_16(curr_size), PADSZ(curr_size,16));
    int alloc_pos = PAD_16(curr_size);
    curr_size = alloc_pos + alloc_size;

    /* Add 64-1 or 4096-1 to allow window alignment, and round size of buffer up to multiple of 64 */
    int total_size = PAD_64(curr_size + (WINDOW_PAD_SIZE - 1));

    /* Allocate buffer, align to 64-byte cacheline, and zerofill the resulting buffer */
    char *original_buf = (char *)strm->zalloc(strm->opaque, 1, total_size);
    if (original_buf == NULL)
        return NULL;

    char *buff = (char *)HINT_ALIGNED_WINDOW((char *)PAD_WINDOW(original_buf));
    LOGSZPL("Buffer alloc", total_size, PADSZ((uintptr_t)original_buf,WINDOW_PAD_SIZE), PADSZ(curr_size,WINDOW_PAD_SIZE));

    /* Initialize alloc_bufs */
    deflate_allocs *alloc_bufs  = (struct deflate_allocs_s *)(buff + alloc_pos);
    alloc_bufs->buf_start = original_buf;
    alloc_bufs->zfree = strm->zfree;

    /* Assign buffers */
    alloc_bufs->window = (unsigned char *)HINT_ALIGNED_WINDOW(buff + window_pos);
    alloc_bufs->prev = (Pos *)HINT_ALIGNED_64(buff + prev_pos);
    alloc_bufs->head = (Pos *)HINT_ALIGNED_64(buff + head_pos);
    alloc_bufs->pending_buf = (unsigned char *)HINT_ALIGNED_64(buff + pending_pos);
    alloc_bufs->state = (deflate_state *)HINT_ALIGNED_16(buff + state_pos);

    memset((char *)alloc_bufs->prev, 0, prev_size);

    return alloc_bufs;
}